

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionCube<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  
  uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar14 = uVar10 + 3;
  if (-1 < (int)uVar10) {
    uVar14 = uVar10;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar11 = 0;
      auVar28 = ZEXT864(0);
      do {
        if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
          pfVar3 = transitionMatrices[probabilityIndices[uVar11]];
          lVar19 = 0;
          iVar20 = 0;
          do {
            uVar21 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            if (0 < (int)uVar21) {
              lVar18 = 0;
              do {
                dVar23 = exp((double)((float)edgeLengths[uVar11] *
                                     (this->super_EigenDecomposition<float,_1>).gEigenValues
                                     [eigenIndices[lVar19]][lVar18]));
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar18] = (float)dVar23;
                lVar18 = lVar18 + 1;
                uVar21 = (this->super_EigenDecomposition<float,_1>).kStateCount;
              } while (lVar18 < (int)uVar21);
              auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            if (0 < (int)uVar21) {
              pfVar12 = this->gCMatrices[eigenIndices[lVar19]];
              uVar22 = 0;
              do {
                pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                uVar15 = 0;
                lVar18 = (long)iVar20;
                do {
                  lVar16 = lVar18;
                  if ((int)uVar10 < 4) {
                    uVar17 = 0;
                    auVar26 = ZEXT864(0);
                  }
                  else {
                    auVar26 = ZEXT864(0);
                    uVar17 = 0;
                    do {
                      auVar27 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar17]),auVar26._0_16_,
                                                ZEXT416((uint)pfVar4[uVar17]));
                      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)pfVar12[uVar17 + 1]),
                                                ZEXT416((uint)pfVar4[uVar17 + 1]));
                      auVar27 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar17 + 2]),auVar27,
                                                ZEXT416((uint)pfVar4[uVar17 + 2]));
                      auVar27 = vfmadd132ss_fma(ZEXT416((uint)pfVar12[uVar17 + 3]),auVar27,
                                                ZEXT416((uint)pfVar4[uVar17 + 3]));
                      auVar26 = ZEXT1664(auVar27);
                      uVar17 = uVar17 + 4;
                    } while ((long)uVar17 < (long)(int)(uVar14 & 0xfffffffc));
                  }
                  auVar27 = auVar26._0_16_;
                  if ((int)uVar17 < (int)uVar21) {
                    uVar17 = uVar17 & 0xffffffff;
                    do {
                      auVar27 = vfmadd231ss_fma(auVar26._0_16_,ZEXT416((uint)pfVar12[uVar17]),
                                                ZEXT416((uint)pfVar4[uVar17]));
                      auVar26 = ZEXT1664(auVar27);
                      uVar17 = uVar17 + 1;
                    } while (uVar21 != uVar17);
                  }
                  auVar27 = vmaxss_avx(auVar27,auVar28._0_16_);
                  pfVar12 = pfVar12 + uVar21;
                  pfVar3[lVar16] = auVar27._0_4_;
                  uVar15 = uVar15 + 1;
                  lVar18 = lVar16 + 1;
                } while (uVar15 != uVar21);
                pfVar3[(int)(lVar16 + 1)] = 1.0;
                iVar20 = (int)lVar16 + 2;
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar21);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar11 = 0;
      auVar28 = ZEXT864(0);
      do {
        if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
          pfVar3 = transitionMatrices[probabilityIndices[uVar11]];
          pfVar12 = transitionMatrices[firstDerivativeIndices[uVar11]];
          lVar19 = 0;
          iVar20 = 0;
          do {
            uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            if (0 < (int)uVar10) {
              lVar18 = 0;
              do {
                fVar1 = (this->super_EigenDecomposition<float,_1>).gEigenValues
                        [eigenIndices[lVar19]][lVar18];
                dVar23 = exp((double)(fVar1 * (float)edgeLengths[uVar11]));
                (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar18] = (float)dVar23;
                (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar18] =
                     (float)dVar23 * fVar1;
                lVar18 = lVar18 + 1;
                uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
              } while (lVar18 < (int)uVar10);
              auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            if (0 < (int)uVar10) {
              iVar2 = eigenIndices[lVar19];
              uVar14 = 0;
              lVar18 = 0;
              do {
                pfVar4 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                pfVar5 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
                pfVar6 = this->gCMatrices[iVar2];
                uVar21 = 0;
                lVar16 = (long)iVar20;
                do {
                  lVar13 = lVar16;
                  auVar25 = ZEXT816(0) << 0x40;
                  uVar17 = 0;
                  auVar27 = ZEXT816(0) << 0x40;
                  do {
                    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)pfVar6[(long)(int)lVar18 +
                                                                           uVar17]),
                                              ZEXT416((uint)pfVar4[uVar17]));
                    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)pfVar6[(long)(int)lVar18 +
                                                                           uVar17]),
                                              ZEXT416((uint)pfVar5[uVar17]));
                    uVar17 = uVar17 + 1;
                  } while (uVar10 != uVar17);
                  lVar18 = (long)(int)lVar18 + (ulong)uVar10;
                  auVar27 = vmaxss_avx(auVar27,auVar28._0_16_);
                  pfVar3[lVar13] = auVar27._0_4_;
                  pfVar12[lVar13] = auVar25._0_4_;
                  uVar21 = uVar21 + 1;
                  lVar16 = lVar13 + 1;
                } while (uVar21 != uVar10);
                iVar20 = (int)(lVar13 + 1);
                pfVar3[iVar20] = 1.0;
                pfVar12[iVar20] = 0.0;
                iVar20 = (int)lVar13 + 2;
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar10);
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uint)count);
    }
  }
  else if (0 < count) {
    auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar11 = 0;
    do {
      if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
        pfVar3 = transitionMatrices[probabilityIndices[uVar11]];
        pfVar12 = transitionMatrices[firstDerivativeIndices[uVar11]];
        pfVar4 = transitionMatrices[secondDerivativeIndices[uVar11]];
        lVar19 = 0;
        iVar20 = 0;
        do {
          uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          if (0 < (int)uVar10) {
            lVar18 = 0;
            do {
              fVar1 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndices[lVar19]]
                      [lVar18];
              dVar23 = exp((double)(fVar1 * (float)edgeLengths[uVar11]));
              (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar18] = (float)dVar23;
              fVar9 = fVar1 * (float)dVar23;
              (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar18] = fVar9;
              (this->super_EigenDecomposition<float,_1>).secondDerivTmp[lVar18] = fVar1 * fVar9;
              lVar18 = lVar18 + 1;
              uVar10 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            } while (lVar18 < (int)uVar10);
            auVar28 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          if (0 < (int)uVar10) {
            iVar2 = eigenIndices[lVar19];
            uVar14 = 0;
            lVar18 = 0;
            do {
              pfVar5 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
              pfVar6 = (this->super_EigenDecomposition<float,_1>).firstDerivTmp;
              pfVar7 = (this->super_EigenDecomposition<float,_1>).secondDerivTmp;
              pfVar8 = this->gCMatrices[iVar2];
              uVar21 = 0;
              lVar16 = (long)iVar20;
              do {
                lVar13 = lVar16;
                auVar24 = ZEXT816(0) << 0x40;
                uVar17 = 0;
                auVar25 = ZEXT816(0) << 0x40;
                auVar27 = ZEXT816(0) << 0x40;
                do {
                  fVar1 = pfVar8[(long)(int)lVar18 + uVar17];
                  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar1),
                                            ZEXT416((uint)pfVar5[uVar17]));
                  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar1),
                                            ZEXT416((uint)pfVar6[uVar17]));
                  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar1),
                                            ZEXT416((uint)pfVar7[uVar17]));
                  uVar17 = uVar17 + 1;
                } while (uVar10 != uVar17);
                lVar18 = (long)(int)lVar18 + (ulong)uVar10;
                auVar27 = vmaxss_avx(auVar27,auVar28._0_16_);
                pfVar3[lVar13] = auVar27._0_4_;
                pfVar12[lVar13] = auVar25._0_4_;
                pfVar4[lVar13] = auVar24._0_4_;
                uVar21 = uVar21 + 1;
                lVar16 = lVar13 + 1;
              } while (uVar21 != uVar10);
              iVar20 = (int)(lVar13 + 1);
              pfVar3[iVar20] = 1.0;
              pfVar12[iVar20] = 0.0;
              pfVar4[iVar20] = 0.0;
              iVar20 = (int)lVar13 + 2;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar10);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL													  
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
													  
	if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
                for (int i = 0; i < kStateCount; i++) {
					matrixTmp[i] = exp(gEigenValues[eigenIndices[l]][i] * ((REALTYPE)edgeLengths[u]));
                }
				
                REALTYPE* tmpCMatrices = gCMatrices[eigenIndices[l]];
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
#ifdef UNROLL						
						int k = 0;
						for (; k < stateCountModFour; k += 4) {
							sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
							sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
							sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
							sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
						}
						for (; k < kStateCount; k++) {
							sum += tmpCMatrices[k] * matrixTmp[k];
						}
						tmpCMatrices += kStateCount;
#else
						for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif						
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
					n += T_PAD;
}
				}
			}
			
			if (DEBUGGING_OUTPUT) {
                int kMatrixSize = kStateCount * kStateCount;
				fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
				for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
					fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
			}
		}
        

	} else if (secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	} else {		
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
					secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						REALTYPE sumD2 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							sumD2 += gCMatrices[eigenIndices[l]][m] * secondDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						secondDerivMat[n] = sumD2;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
                    secondDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	}
}